

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall
corr_stack::push(corr_stack *this,wchar_t *str,size_t strl,int dist,int repl,size_t ipos,
                vmdict_TrieNode *node,corr_type typ)

{
  corr_state *pcVar1;
  corr_state *pcVar2;
  
  pcVar2 = (corr_state *)corr_state::operator_new(0x38,strl);
  pcVar1 = this->top;
  memcpy(pcVar2->str,str,strl * 4);
  pcVar2->strl = strl;
  pcVar2->dist = dist;
  pcVar2->repl = repl;
  pcVar2->ipos = ipos;
  pcVar2->node = node;
  pcVar2->typ = typ;
  pcVar2->nxt = pcVar1;
  this->top = pcVar2;
  return;
}

Assistant:

void push(const wchar_t *str, size_t strl, int dist, int repl,
              size_t ipos, vmdict_TrieNode *node, corr_type typ)
    {
        top = new (strl) corr_state(
            str, strl, dist, repl, ipos, node, typ, top);
    }